

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O2

mraa_result_t gpio_get(int pin,int *level,mraa_boolean_t raw)

{
  int iVar1;
  mraa_result_t mVar2;
  long lVar3;
  
  lVar3 = mraa_gpio_init();
  if (lVar3 == 0) {
    mVar2 = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    mraa_gpio_dir(lVar3,1);
    if (raw != 0) {
      iVar1 = mraa_gpio_use_mmaped(lVar3,1);
      if (iVar1 != 0) {
        fprintf(_stdout,"mmapped access to gpio %d not supported, falling back to normal mode\n",pin
               );
      }
    }
    iVar1 = mraa_gpio_read(lVar3);
    *level = iVar1;
    mVar2 = MRAA_SUCCESS;
  }
  return mVar2;
}

Assistant:

mraa_result_t
gpio_get(int pin, int* level, mraa_boolean_t raw)
{
    mraa_gpio_context gpio = mraa_gpio_init(pin);
    if (gpio != NULL) {
        mraa_gpio_dir(gpio, MRAA_GPIO_IN);
        if (raw != 0) {
            if (mraa_gpio_use_mmaped(gpio, 1) != MRAA_SUCCESS) {
                fprintf(stdout,
                        "mmapped access to gpio %d not supported, falling back to normal mode\n", pin);
            }
        }
        *level = mraa_gpio_read(gpio);
        return MRAA_SUCCESS;
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}